

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen-x86_64.c
# Opt level: O2

int setup_imm_addr(gen_ctx *gen_ctx,uint64_t v,int *mod,int *rm,int64_t *disp32,int call_p,
                  MIR_item_t func_item)

{
  VARR_uint64_t *varr;
  VARR_const_ref_t *pVVar1;
  size_t sVar2;
  const_ref_t *__ptr;
  ulong uVar3;
  size_t sVar4;
  
  varr = gen_ctx->target_ctx->const_pool;
  if (varr == (VARR_uint64_t *)0x0) {
    mir_varr_assert_fail("addr","uint64_t");
  }
  sVar4 = varr->els_num;
  for (sVar2 = 0; sVar4 != sVar2; sVar2 = sVar2 + 1) {
    if (varr->varr[sVar2] == v) goto LAB_00147b7f;
  }
  VARR_uint64_tpush(varr,v);
  sVar2 = sVar4;
LAB_00147b7f:
  if (((*mod < 0) && (*rm < 0)) && (*disp32 < 0)) {
    setup_r((int *)0x0,rm,5);
    setup_mod(mod,0);
    *disp32 = 0;
    pVVar1 = gen_ctx->target_ctx->const_refs;
    __ptr = pVVar1->varr;
    if (__ptr == (const_ref_t *)0x0) {
      mir_varr_assert_fail("expand","const_ref_t");
    }
    sVar4 = pVVar1->els_num;
    uVar3 = sVar4 + 1;
    if (pVVar1->size < uVar3) {
      sVar4 = (uVar3 >> 1) + uVar3;
      __ptr = (const_ref_t *)realloc(__ptr,sVar4 * 0x28);
      pVVar1->varr = __ptr;
      pVVar1->size = sVar4;
      sVar4 = pVVar1->els_num;
      uVar3 = sVar4 + 1;
    }
    pVVar1->els_num = uVar3;
    __ptr[sVar4].call_p = call_p;
    __ptr[sVar4].func_item = func_item;
    __ptr[sVar4].pc = 0;
    (&__ptr[sVar4].pc)[1] = 0;
    __ptr[sVar4].const_num = sVar2;
    sVar4 = VARR_const_ref_tlength(gen_ctx->target_ctx->const_refs);
    return (int)sVar4 + -1;
  }
  __assert_fail("*mod < 0 && *rm < 0 && *disp32 < 0",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                ,0x886,"void setup_rip_rel_addr(MIR_disp_t, int *, int *, int64_t *)");
}

Assistant:

static int setup_imm_addr (struct gen_ctx *gen_ctx, uint64_t v, int *mod, int *rm, int64_t *disp32,
                           int call_p, MIR_item_t func_item) {
  const_ref_t cr;
  size_t n;

  n = add_to_const_pool (gen_ctx, v);
  setup_rip_rel_addr (0, mod, rm, disp32);
  cr.call_p = call_p;
  cr.func_item = func_item;
  cr.pc = 0;
  cr.next_insn_disp = 0;
  cr.const_num = n;
  VARR_PUSH (const_ref_t, const_refs, cr);
  return (int) VARR_LENGTH (const_ref_t, const_refs) - 1;
}